

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O3

int ppc_store_slb(PowerPCCPU_conflict3 *cpu,target_ulong slot,target_ulong esid,target_ulong vsid)

{
  PPCHash64Options *pPVar1;
  long lVar2;
  
  if ((((-1 < (long)vsid) && ((esid & 0x7ffffff) == 0)) &&
      (pPVar1 = cpu->hash64_opts, slot < pPVar1->slb_size)) &&
     ((vsid >> 0x3e == 0 || ((pPVar1->flags & 1) != 0)))) {
    lVar2 = 0;
    do {
      if (*(int *)((long)&((PPCHash64SegmentPageSizes *)(pPVar1->sps[0].enc + -1))->page_shift +
                  lVar2) == 0) {
        return -1;
      }
      if (((uint)vsid & 0x130) == *(uint *)((long)pPVar1->sps[0].enc + lVar2 + -4)) {
        (cpu->env).slb[slot].esid = esid;
        (cpu->env).slb[slot].vsid = vsid;
        (cpu->env).slb[slot].sps =
             (PPCHash64SegmentPageSizes *)
             ((long)&((PPCHash64SegmentPageSizes *)(pPVar1->sps[0].enc + -1))->page_shift + lVar2);
        return 0;
      }
      lVar2 = lVar2 + 0x48;
    } while (lVar2 != 0x240);
  }
  return -1;
}

Assistant:

int ppc_store_slb(PowerPCCPU *cpu, target_ulong slot,
                  target_ulong esid, target_ulong vsid)
{
    CPUPPCState *env = &cpu->env;
    ppc_slb_t *slb = &env->slb[slot];
    const PPCHash64SegmentPageSizes *sps = NULL;
    int i;

    if (slot >= cpu->hash64_opts->slb_size) {
        return -1; /* Bad slot number */
    }
    if (esid & ~(SLB_ESID_ESID | SLB_ESID_V)) {
        return -1; /* Reserved bits set */
    }
    if (vsid & (SLB_VSID_B & ~SLB_VSID_B_1T)) {
        return -1; /* Bad segment size */
    }
    if ((vsid & SLB_VSID_B) && !(ppc_hash64_has(cpu, PPC_HASH64_1TSEG))) {
        return -1; /* 1T segment on MMU that doesn't support it */
    }

    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64SegmentPageSizes *sps1 = &cpu->hash64_opts->sps[i];

        if (!sps1->page_shift) {
            break;
        }

        if ((vsid & SLB_VSID_LLP_MASK) == sps1->slb_enc) {
            sps = sps1;
            break;
        }
    }

    if (!sps) {
#if 0
        error_report("Bad page size encoding in SLB store: slot "TARGET_FMT_lu
                     " esid 0x"TARGET_FMT_lx" vsid 0x"TARGET_FMT_lx,
                     slot, esid, vsid);
#endif
        return -1;
    }

    slb->esid = esid;
    slb->vsid = vsid;
    slb->sps = sps;

#if 0
    LOG_SLB("%s: " TARGET_FMT_lu " " TARGET_FMT_lx " - " TARGET_FMT_lx
            " => %016" PRIx64 " %016" PRIx64 "\n", __func__, slot, esid, vsid,
            slb->esid, slb->vsid);
#endif

    return 0;
}